

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChCollisionModel::AddConvexHullsFromFile
          (ChCollisionModel *this,shared_ptr<chrono::ChMaterialSurface> *material,
          ChStreamInAscii *mstream,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  int iVar4;
  ChException *this_00;
  long lVar5;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> ptlist;
  float vz;
  float vy;
  float vx;
  char bufdata [200];
  void *local_1a8;
  void *pvStack_1a0;
  long local_198;
  float local_184;
  uint local_180;
  uint local_17c;
  shared_ptr<chrono::ChMaterialSurface> *local_178;
  ChCollisionModel *local_170;
  ChVector<double> *local_168;
  ChMatrix33<double> *local_160;
  element_type *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_150;
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  string local_138;
  undefined1 local_118 [16];
  double local_108;
  undefined4 local_f8;
  char local_f4;
  
  local_198 = 0;
  local_1a8 = (void *)0x0;
  pvStack_1a0 = (void *)0x0;
  local_178 = material;
  local_170 = this;
  local_168 = pos;
  local_160 = rot;
  do {
    iVar4 = (*(mstream->super_ChStreamIn)._vptr_ChStreamIn[2])(mstream);
    if ((char)iVar4 != '\0') {
      if (pvStack_1a0 != local_1a8) {
        local_158 = (local_178->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        p_Stack_150 = (local_178->
                      super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
        p_Var2 = (local_178->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        (*local_170->_vptr_ChCollisionModel[0xf])
                  (local_170,&local_158,&local_1a8,local_168,local_160);
        if (p_Stack_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_150);
        }
      }
      if (pvStack_1a0 != local_1a8) {
        pvStack_1a0 = local_1a8;
      }
      if (local_1a8 != (void *)0x0) {
        operator_delete(local_1a8,local_198 - (long)local_1a8);
      }
      return true;
    }
    lVar5 = 0;
    while (iVar4 = (*(mstream->super_ChStreamIn)._vptr_ChStreamIn[2])(mstream), (char)iVar4 == '\0')
    {
      (*(mstream->super_ChStreamIn)._vptr_ChStreamIn[5])(mstream,(char *)((long)&local_f8 + lVar5));
      cVar1 = *(char *)((long)&local_f8 + lVar5);
      if ((cVar1 == '\r') || (cVar1 == '\n')) {
        *(undefined1 *)((long)&local_f8 + lVar5) = 0;
        break;
      }
      lVar5 = lVar5 + 1;
      if (lVar5 == 200) {
        this_00 = (ChException *)__cxa_allocate_exception(0x28);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Too long line in parsing","");
        ChException::ChException(this_00,&local_138);
        __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
      }
    }
    *(undefined1 *)((long)&local_f8 + lVar5 + 1) = 0;
    if (local_f4 == '\0' && local_f8 == 0x6c6c7568) {
      if (pvStack_1a0 != local_1a8) {
        local_148 = (local_178->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        p_Stack_140 = (local_178->
                      super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
        p_Var2 = (local_178->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        (*local_170->_vptr_ChCollisionModel[0xf])
                  (local_170,&local_148,&local_1a8,local_168,local_160);
        if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
        }
      }
      if (pvStack_1a0 != local_1a8) {
        pvStack_1a0 = local_1a8;
      }
    }
    iVar4 = __isoc99_sscanf(&local_f8,"%g %g %g",&local_17c,&local_180,&local_184);
    if (iVar4 == 3) {
      local_108 = (double)local_184;
      auVar3 = vinsertps_avx(ZEXT416(local_17c),ZEXT416(local_180),0x10);
      local_118 = vcvtps2pd_avx(auVar3);
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      emplace_back<chrono::ChVector<double>>
                ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                 &local_1a8,(ChVector<double> *)local_118);
    }
  } while( true );
}

Assistant:

bool ChCollisionModel::AddConvexHullsFromFile(std::shared_ptr<ChMaterialSurface> material,
                                              ChStreamInAscii& mstream,
                                              const ChVector<>& pos,
                                              const ChMatrix33<>& rot) {
    std::vector<ChVector<double> > ptlist;

    char bufdata[200];
    int linechar = 0;
    while (!mstream.End_of_stream()) {
        // read one line
        linechar = 0;
        while (!mstream.End_of_stream()) {
            try {
                mstream >> bufdata[linechar];
            } catch (const ChException &) {
            };
            if ((bufdata[linechar] == (char)13) || (bufdata[linechar] == (char)10)) {
                bufdata[linechar] = 0;
                break;
            }
            linechar++;
            if (linechar >= 200)
                throw(ChException("Too long line in parsing"));
        }
        bufdata[linechar + 1] = 0;

        ////bool parsedline = false;
        if (bufdata[0] != *"#") {
            ////parsedline = true;
        }
        if (strcmp(bufdata, "hull") == 0) {
            if (ptlist.size())
                this->AddConvexHull(material, ptlist, pos, rot);
            ptlist.clear();
            ////parsedline = true;
        }
        float vx, vy, vz;
        if (sscanf(bufdata, "%g %g %g", &vx, &vy, &vz) == 3) {
            ptlist.push_back(ChVector<>(vx, vy, vz));
            ////parsedline = true;
        }
    }
    
    if (ptlist.size())
        this->AddConvexHull(material, ptlist, pos, rot);
    ptlist.clear();

    return true;
}